

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O2

void __thiscall TCLAP::ArgException::~ArgException(ArgException *this)

{
  *(undefined ***)this = &PTR__ArgException_0011e940;
  std::__cxx11::string::~string((string *)&this->_typeDescription);
  std::__cxx11::string::~string((string *)&this->_argId);
  std::__cxx11::string::~string((string *)&this->_errorText);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~ArgException() throw() { }